

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

QPromise<void> QtPromise::resolve(void)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> extraout_RDX;
  QPromise<void> *in_RDI;
  QPromise<void> QVar1;
  anon_class_1_0_00000001 local_11 [9];
  
  QPromise<void>::QPromise<QtPromise::resolve()::_lambda(QtPromise::QPromiseResolve<void>const&)_1_>
            (in_RDI,local_11);
  QVar1.super_QPromiseBase<void>.m_d.d = extraout_RDX.d;
  QVar1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)in_RDI;
  return (QPromise<void>)QVar1.super_QPromiseBase<void>;
}

Assistant:

static inline QPromise<void> resolve()
{
    return QPromise<void>{[](const QPromiseResolve<void>& resolve) {
        resolve();
    }};
}